

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_data_zipx_lzma_alone(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int64_t *piVar1;
  lzma_stream *plVar2;
  zip *zip;
  zip_entry *pzVar3;
  uint64_t request;
  uint64_t uVar4;
  bool bVar5;
  lzma_ret lVar6;
  wchar_t wVar7;
  void *pvVar8;
  uint8_t *puVar9;
  uchar *puVar10;
  ulong uVar11;
  size_t sVar12;
  char *pcVar13;
  int iVar14;
  ssize_t bytes_avail;
  undefined8 local_40;
  undefined5 uStack_38;
  
  zip = (zip *)a->format->data;
  if (zip->decompress_init == '\0') {
    if (zip->zipx_lzma_valid != '\0') {
      lzma_end(&zip->zipx_lzma_stream);
      zip->zipx_lzma_valid = '\0';
    }
    plVar2 = &zip->zipx_lzma_stream;
    memset(plVar2,0,0x88);
    lVar6 = lzma_alone_decoder(plVar2,0xffffffffffffffff);
    if (lVar6 == LZMA_OK) {
      zip->zipx_lzma_valid = '\x01';
      if ((zip->entry_bytes_remaining < 9) ||
         (pvVar8 = __archive_read_ahead(a,9,(ssize_t *)0x0), pvVar8 == (void *)0x0)) {
        pcVar13 = "Truncated lzma data";
LAB_00642310:
        iVar14 = 0x54;
      }
      else {
        if ((*(char *)((long)pvVar8 + 2) != '\x05') || (*(char *)((long)pvVar8 + 3) != '\0')) {
          pcVar13 = "Invalid lzma data";
          goto LAB_00642310;
        }
        local_40._0_4_ = *(undefined4 *)((long)pvVar8 + 4);
        local_40._4_4_ = CONCAT31(0xffffff,*(undefined1 *)((long)pvVar8 + 8));
        uStack_38 = 0xffffffffff;
        if (zip->uncompressed_buffer == (uchar *)0x0) {
          zip->uncompressed_buffer_size = 0x40000;
          puVar10 = (uchar *)malloc(0x40000);
          zip->uncompressed_buffer = puVar10;
          if (puVar10 != (uchar *)0x0) goto LAB_0064252b;
          pcVar13 = "No memory for lzma decompression";
          iVar14 = 0xc;
        }
        else {
LAB_0064252b:
          (zip->zipx_lzma_stream).next_in = (uint8_t *)&local_40;
          (zip->zipx_lzma_stream).avail_in = 0xd;
          wVar7 = L'\0';
          (zip->zipx_lzma_stream).total_in = 0;
          (zip->zipx_lzma_stream).next_out = zip->uncompressed_buffer;
          (zip->zipx_lzma_stream).avail_out = zip->uncompressed_buffer_size;
          (zip->zipx_lzma_stream).total_out = 0;
          lVar6 = lzma_code(plVar2,LZMA_RUN);
          if (lVar6 == LZMA_OK) {
            __archive_read_consume(a,9);
            zip->entry_bytes_remaining = zip->entry_bytes_remaining + -9;
            zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + 9;
            zip->decompress_init = '\x01';
            bVar5 = true;
            goto LAB_00642327;
          }
          pcVar13 = "lzma stream initialization error";
          iVar14 = 0x16;
        }
      }
      bVar5 = false;
      archive_set_error(&a->archive,iVar14,pcVar13);
      wVar7 = L'\xffffffe2';
    }
    else {
      bVar5 = false;
      archive_set_error(&a->archive,-1,"lzma initialization failed(%d)",(ulong)lVar6);
      wVar7 = L'\xffffffe7';
    }
LAB_00642327:
    if (!bVar5) {
      return wVar7;
    }
  }
  puVar9 = (uint8_t *)__archive_read_ahead(a,1,&local_40);
  if (local_40._4_4_ < 0) {
    pcVar13 = "Truncated lzma file body";
    iVar14 = 0x54;
LAB_006423f8:
    archive_set_error(&a->archive,iVar14,pcVar13);
LAB_006424b9:
    wVar7 = L'\xffffffe2';
  }
  else {
    pzVar3 = zip->entry;
    sVar12 = CONCAT44(local_40._4_4_,(undefined4)local_40);
    if (zip->entry_bytes_remaining < (long)CONCAT44(local_40._4_4_,(undefined4)local_40)) {
      sVar12 = zip->entry_bytes_remaining;
    }
    plVar2 = &zip->zipx_lzma_stream;
    (zip->zipx_lzma_stream).next_in = puVar9;
    (zip->zipx_lzma_stream).avail_in = sVar12;
    (zip->zipx_lzma_stream).total_in = 0;
    (zip->zipx_lzma_stream).next_out = zip->uncompressed_buffer;
    sVar12 = pzVar3->uncompressed_size - zip->entry_uncompressed_bytes_read;
    if ((long)zip->uncompressed_buffer_size < (long)sVar12) {
      sVar12 = zip->uncompressed_buffer_size;
    }
    (zip->zipx_lzma_stream).avail_out = sVar12;
    (zip->zipx_lzma_stream).total_out = 0;
    lVar6 = lzma_code(plVar2,LZMA_RUN);
    if (lVar6 != LZMA_OK) {
      if (lVar6 != LZMA_STREAM_END) {
        if (lVar6 == LZMA_DATA_ERROR) {
          pcVar13 = "lzma data error (error %d)";
          uVar11 = 9;
        }
        else {
          pcVar13 = "lzma unknown error %d";
          uVar11 = (ulong)lVar6;
        }
        archive_set_error(&a->archive,-1,pcVar13,uVar11);
        goto LAB_006424b9;
      }
      lzma_end(plVar2);
      zip->zipx_lzma_valid = '\0';
      if ((zip->zipx_lzma_stream).total_in != zip->entry_bytes_remaining) {
        pcVar13 = "lzma alone premature end of stream";
        iVar14 = -1;
        goto LAB_006423f8;
      }
      zip->end_of_entry = '\x01';
    }
    request = (zip->zipx_lzma_stream).total_in;
    __archive_read_consume(a,request);
    zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + request;
    uVar4 = (zip->zipx_lzma_stream).total_out;
    zip->entry_uncompressed_bytes_read = zip->entry_uncompressed_bytes_read + uVar4;
    piVar1 = &zip->entry_bytes_remaining;
    *piVar1 = *piVar1 - request;
    if (*piVar1 == 0) {
      zip->end_of_entry = '\x01';
    }
    *size = uVar4;
    *buff = zip->uncompressed_buffer;
    wVar7 = consume_optional_marker(a,zip);
    if ((wVar7 == L'\0') && (wVar7 = L'\0', zip->end_of_entry != '\0')) {
      lzma_end(plVar2);
      zip->zipx_lzma_valid = '\0';
    }
  }
  return wVar7;
}

Assistant:

static int
zip_read_data_zipx_lzma_alone(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	lzma_ret lz_ret;
	const void* compressed_buf;
	ssize_t bytes_avail, in_bytes, to_consume;

	(void) offset; /* UNUSED */

	/* Initialize decompressor if not yet initialized. */
	if (!zip->decompress_init) {
		ret = zipx_lzma_alone_init(a, zip);
		if (ret != ARCHIVE_OK)
			return (ret);
	}

	/* Fetch more compressed data. The same note as in deflate handler
	 * applies here as well:
	 *
	 * Note: '1' here is a performance optimization. Recall that the
	 * decompression layer returns a count of available bytes; asking for
	 * more than that forces the decompressor to combine reads by copying
	 * data.
	 */
	compressed_buf = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated lzma file body");
		return (ARCHIVE_FATAL);
	}

	/* Set decompressor parameters. */
	in_bytes = zipmin(zip->entry_bytes_remaining, bytes_avail);

	zip->zipx_lzma_stream.next_in = compressed_buf;
	zip->zipx_lzma_stream.avail_in = in_bytes;
	zip->zipx_lzma_stream.total_in = 0;
	zip->zipx_lzma_stream.next_out = zip->uncompressed_buffer;
	zip->zipx_lzma_stream.avail_out =
		/* These lzma_alone streams lack end of stream marker, so let's
		 * make sure the unpacker won't try to unpack more than it's
		 * supposed to. */
		zipmin((int64_t) zip->uncompressed_buffer_size,
		    zip->entry->uncompressed_size -
		    zip->entry_uncompressed_bytes_read);
	zip->zipx_lzma_stream.total_out = 0;

	/* Perform the decompression. */
	lz_ret = lzma_code(&zip->zipx_lzma_stream, LZMA_RUN);
	switch(lz_ret) {
		case LZMA_DATA_ERROR:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lzma data error (error %d)", (int) lz_ret);
			return (ARCHIVE_FATAL);

		/* This case is optional in lzma alone format. It can happen,
		 * but most of the files don't have it. (GitHub #1257) */
		case LZMA_STREAM_END:
			lzma_end(&zip->zipx_lzma_stream);
			zip->zipx_lzma_valid = 0;
			if((int64_t) zip->zipx_lzma_stream.total_in !=
			    zip->entry_bytes_remaining)
			{
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "lzma alone premature end of stream");
				return (ARCHIVE_FATAL);
			}

			zip->end_of_entry = 1;
			break;

		case LZMA_OK:
			break;

		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lzma unknown error %d", (int) lz_ret);
			return (ARCHIVE_FATAL);
	}

	to_consume = zip->zipx_lzma_stream.total_in;

	/* Update pointers. */
	__archive_read_consume(a, to_consume);
	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += zip->zipx_lzma_stream.total_out;

	if(zip->entry_bytes_remaining == 0) {
		zip->end_of_entry = 1;
	}

	/* Return values. */
	*size = zip->zipx_lzma_stream.total_out;
	*buff = zip->uncompressed_buffer;

	/* Behave the same way as during deflate decompression. */
	ret = consume_optional_marker(a, zip);
	if (ret != ARCHIVE_OK)
		return (ret);

	/* Free lzma decoder handle because we'll no longer need it. */
	if(zip->end_of_entry) {
		lzma_end(&zip->zipx_lzma_stream);
		zip->zipx_lzma_valid = 0;
	}

	/* If we're here, then we're good! */
	return (ARCHIVE_OK);
}